

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O1

void __thiscall
wasm::ToolOptions::ToolOptions(ToolOptions *this,string *command,string *description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  ToolOptions *pTVar3;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  code *local_6a8;
  code *local_6a0;
  ToolOptions *local_698;
  undefined8 uStack_690;
  code *local_688;
  code *pcStack_680;
  ToolOptions *local_678;
  undefined8 uStack_670;
  code *local_668;
  code *pcStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  code *local_648;
  code *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  code *local_628;
  code *local_620;
  ToolOptions *local_618;
  undefined8 uStack_610;
  code *local_608;
  code *pcStack_600;
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  long *local_4f8 [2];
  long local_4e8 [2];
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  ToolOptions *local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  code *pcStack_2e0;
  code **local_2d8;
  undefined8 uStack_2d0;
  code *local_2c8;
  code *local_2c0;
  ToolOptions *local_2b8;
  undefined8 uStack_2b0;
  code *local_2a8;
  code *pcStack_2a0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  wasm::Options::Options(&this->super_Options,(string *)command,(string *)description);
  (this->passOptions).debug = false;
  (this->passOptions).validate = true;
  (this->passOptions).validateGlobally = true;
  (this->passOptions).optimizeLevel = 0;
  (this->passOptions).shrinkLevel = 0;
  (this->passOptions).inlining.alwaysInlineMaxSize = 2;
  (this->passOptions).inlining.oneCallerInlineMaxSize = 0xffffffff;
  (this->passOptions).inlining.flexibleInlineMaxSize = 0x14;
  (this->passOptions).inlining.allowFunctionsWithLoops = false;
  (this->passOptions).zeroFilledMemory = false;
  (this->passOptions).closedWorld = false;
  (this->passOptions).debugInfo = false;
  (this->passOptions).targetJS = false;
  *(undefined8 *)&(this->passOptions).inlining.partialInliningIfs = 0;
  (this->passOptions).arguments._M_h._M_buckets =
       &(this->passOptions).arguments._M_h._M_single_bucket;
  (this->passOptions).arguments._M_h._M_bucket_count = 1;
  (this->passOptions).arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->passOptions).arguments._M_h._M_element_count = 0;
  (this->passOptions).arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->passOptions).arguments._M_h._M_rehash_policy._M_next_resize = 0;
  (this->passOptions).arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->passOptions).passesToSkip._M_h._M_buckets =
       &(this->passOptions).passesToSkip._M_h._M_single_bucket;
  (this->passOptions).passesToSkip._M_h._M_bucket_count = 1;
  (this->passOptions).passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->passOptions).passesToSkip._M_h._M_element_count = 0;
  (this->passOptions).passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->profile = Normal;
  (this->passOptions).passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  (this->passOptions).passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->passOptions).funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->passOptions).funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->quiet = false;
  this->enabledFeatures = 0x22;
  this->disabledFeatures = 0;
  paVar1 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"--mvp-features","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"-mvp","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"Disable all non-MVP features","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Tool options","");
  local_358._8_8_ = 0;
  local_348._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:46:12)>
       ::_M_invoke;
  local_348._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:46:12)>
       ::_M_manager;
  local_358._0_8_ = this;
  psVar2 = (string *)
           wasm::Options::add((string *)this,(string *)&local_290,(string *)&local_270,
                              (string *)&local_250,(Arguments)&local_230,(function *)0x0,
                              SUB81(local_358,0));
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"--all-features","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"-all","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Enable all features","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Tool options","");
  local_338._8_8_ = 0;
  local_328._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:55:12)>
       ::_M_invoke;
  local_328._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:55:12)>
       ::_M_manager;
  local_338._0_8_ = this;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)&local_210,(string *)&local_1f0,(string *)&local_1d0,
                              (Arguments)&local_1b0,(function *)0x0,SUB81(local_338,0));
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"--detect-features","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"(deprecated - this flag does nothing)","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Tool options","");
  local_318._0_8_ = (pointer)0x0;
  local_318._8_8_ = 0;
  local_308._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:64:12)>
       ::_M_invoke;
  local_308._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:64:12)>
       ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)&local_190,(string *)&local_170,(string *)&local_150,
                              (Arguments)&local_130,(function *)0x0,SUB81(local_318,0));
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--quiet","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"-q","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"Emit less verbose output and hide trivial warnings.","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Tool options","");
  uStack_2f0 = 0;
  pcStack_2e0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:70:12)>
                ::_M_invoke;
  local_2e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:70:12)>
              ::_M_manager;
  local_2f8 = this;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)&local_110,(string *)&local_f0,(string *)local_d0,
                              (Arguments)local_b0,(function *)0x0,SUB81(&local_2f8,0));
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--experimental-poppy","");
  local_2d8 = &local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Parse wast files as Poppy IR for testing purposes.","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Tool options","");
  uStack_2b0 = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:77:9)>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:77:9)>
              ::_M_manager;
  local_2b8 = this;
  wasm::Options::add(psVar2,(string *)local_90,(string *)&local_2d8,(string *)local_70,
                     (Arguments)local_50,(function *)0x0,SUB81(&local_2b8,0));
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,3);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,(ulong)(local_2c8 + 1));
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,3);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((code *)local_308._0_8_ != (code *)0x0) {
    (*(code *)local_308._0_8_)(local_318,local_318,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((code *)local_328._0_8_ != (code *)0x0) {
    (*(code *)local_328._0_8_)(local_338,local_338,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((code *)local_348._0_8_ != (code *)0x0) {
    (*(code *)local_348._0_8_)(local_358,local_358,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"sign extension operations","");
  pTVar3 = addFeature(this,SignExt,&local_290);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"atomic operations","");
  pTVar3 = addFeature(pTVar3,Atomics,&local_270);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"mutable globals","");
  pTVar3 = addFeature(pTVar3,MutableGlobals,&local_250);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"nontrapping float-to-int operations","");
  pTVar3 = addFeature(pTVar3,TruncSat,&local_230);
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,"SIMD operations and types","");
  pTVar3 = addFeature(pTVar3,SIMD,(string *)local_358);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"bulk memory operations","");
  pTVar3 = addFeature(pTVar3,BulkMemory,&local_210);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"exception handling operations","");
  pTVar3 = addFeature(pTVar3,ExceptionHandling,&local_1f0);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"tail call operations","");
  pTVar3 = addFeature(pTVar3,TailCall,&local_1d0);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"reference types","");
  pTVar3 = addFeature(pTVar3,ReferenceTypes,&local_1b0);
  local_338._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"multivalue functions","");
  pTVar3 = addFeature(pTVar3,Multivalue,(string *)local_338);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"garbage collection","");
  pTVar3 = addFeature(pTVar3,GC,&local_190);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"memory64","");
  pTVar3 = addFeature(pTVar3,Memory64,&local_170);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"GC non-null locals","");
  pTVar3 = addFeature(pTVar3,GCNNLocals,&local_150);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"relaxed SIMD","");
  pTVar3 = addFeature(pTVar3,RelaxedSIMD,&local_130);
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"extended const expressions","");
  pTVar3 = addFeature(pTVar3,ExtendedConst,(string *)local_318);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"strings","");
  pTVar3 = addFeature(pTVar3,Strings,&local_110);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"multi-memories","");
  pTVar3 = addFeature(pTVar3,MultiMemories,&local_f0);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"--enable-typed-function-references","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  local_2f8 = (ToolOptions *)&local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,"Deprecated compatibility flag","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Tool options","");
  local_2d8 = (code **)0x0;
  uStack_2d0 = 0;
  local_2c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:102:12)>
              ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:102:12)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add((string *)pTVar3,(string *)local_d0,(string *)local_b0,
                              (string *)&local_2f8,(Arguments)local_90,(function *)0x0,
                              SUB81((string *)&local_2d8,0));
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"--disable-typed-function-references","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  local_2b8 = (ToolOptions *)&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"Deprecated compatibility flag","");
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"Tool options","");
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_6a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:112:12)>
              ::_M_invoke;
  local_6a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:112:12)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)local_70,(string *)local_50,(string *)&local_2b8,
                              (Arguments)local_598,(function *)0x0,SUB81(&local_6b8,0));
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"--no-validation","");
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"-n","");
  local_538[0] = local_528;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,"Disables validation, assumes inputs are correct","");
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"Tool options","");
  uStack_690 = 0;
  pcStack_680 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:122:12)>
                ::_M_invoke;
  local_688 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:122:12)>
              ::_M_manager;
  local_698 = this;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)local_578,(string *)local_558,(string *)local_538,
                              (Arguments)local_518,(function *)0x0,SUB81(&local_698,0));
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"--pass-arg","");
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"-pa","");
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b8,
             "An argument passed along to optimization passes being run. Must be in the form KEY@VALUE"
             ,"");
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Tool options","");
  uStack_670 = 0;
  pcStack_660 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:131:12)>
                ::_M_invoke;
  local_668 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:131:12)>
              ::_M_manager;
  local_678 = this;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)local_4f8,(string *)local_4d8,(string *)local_4b8,
                              (Arguments)local_498,(function *)0x2,SUB81(&local_678,0));
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"--nominal","");
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"");
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438,"Force all GC type definitions to be parsed as nominal.","");
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Tool options","");
  local_658 = 0;
  uStack_650 = 0;
  local_640 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_invoke;
  local_648 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)local_478,(string *)local_458,(string *)local_438,
                              (Arguments)local_418,(function *)0x0,SUB81(&local_658,0));
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"--hybrid","");
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b8,
             "Force all GC type definitions to be parsed using the isorecursive hybrid type system."
             ,"");
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Tool options","");
  local_638 = 0;
  uStack_630 = 0;
  local_620 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:157:12)>
              ::_M_invoke;
  local_628 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:157:12)>
              ::_M_manager;
  psVar2 = (string *)
           wasm::Options::add(psVar2,(string *)local_3f8,(string *)local_3d8,(string *)local_3b8,
                              (Arguments)local_398,(function *)0x0,SUB81(&local_638,0));
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"--closed-world","");
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"-cw","");
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,
             "Assume code outside of the module does not inspect or interact with GC and function references, even if they are passed out. The outside may hold on to them and pass them back in, but not inspect their contents or call them."
             ,"");
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"Tool options","");
  uStack_610 = 0;
  pcStack_600 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:169:9)>
                ::_M_invoke;
  local_608 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:169:9)>
              ::_M_manager;
  local_618 = this;
  wasm::Options::add(psVar2,(string *)local_378,(string *)local_5f8,(string *)local_5d8,
                     (Arguments)local_5b8,(function *)0x0,SUB81(&local_618,0));
  if (local_608 != (code *)0x0) {
    (*local_608)(&local_618,&local_618,3);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if (local_5f8[0] != local_5e8) {
    operator_delete(local_5f8[0],local_5e8[0] + 1);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  if (local_628 != (code *)0x0) {
    (*local_628)(&local_638,&local_638,3);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  if (local_648 != (code *)0x0) {
    (*local_648)(&local_658,&local_658,3);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_478[0] != local_468) {
    operator_delete(local_478[0],local_468[0] + 1);
  }
  if (local_668 != (code *)0x0) {
    (*local_668)(&local_678,&local_678,3);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0],local_4a8[0] + 1);
  }
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],local_4e8[0] + 1);
  }
  if (local_688 != (code *)0x0) {
    (*local_688)(&local_698,&local_698,3);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  if (local_6a8 != (code *)0x0) {
    (*local_6a8)(&local_6b8,&local_6b8,3);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  if (local_2b8 != (ToolOptions *)&local_2a8) {
    operator_delete(local_2b8,(ulong)(local_2a8 + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,3);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_2f8 != (ToolOptions *)&local_2e8) {
    operator_delete(local_2f8,(ulong)(local_2e8 + 1));
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_328) {
    operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ToolOptions(const std::string& command, const std::string& description)
    : Options(command, description) {
    (*this)
      .add("--mvp-features",
           "-mvp",
           "Disable all non-MVP features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setMVP();
             disabledFeatures.setAll();
           })
      .add("--all-features",
           "-all",
           "Enable all features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setAll();
             disabledFeatures.setMVP();
           })
      .add("--detect-features",
           "",
           "(deprecated - this flag does nothing)",
           ToolOptionsCategory,
           Arguments::Zero,
           [](Options*, const std::string&) {})
      .add("--quiet",
           "-q",
           "Emit less verbose output and hide trivial warnings.",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) { quiet = true; })
      .add(
        "--experimental-poppy",
        "",
        "Parse wast files as Poppy IR for testing purposes.",
        ToolOptionsCategory,
        Arguments::Zero,
        [this](Options*, const std::string&) { profile = IRProfile::Poppy; });
    (*this)
      .addFeature(FeatureSet::SignExt, "sign extension operations")
      .addFeature(FeatureSet::Atomics, "atomic operations")
      .addFeature(FeatureSet::MutableGlobals, "mutable globals")
      .addFeature(FeatureSet::TruncSat, "nontrapping float-to-int operations")
      .addFeature(FeatureSet::SIMD, "SIMD operations and types")
      .addFeature(FeatureSet::BulkMemory, "bulk memory operations")
      .addFeature(FeatureSet::ExceptionHandling,
                  "exception handling operations")
      .addFeature(FeatureSet::TailCall, "tail call operations")
      .addFeature(FeatureSet::ReferenceTypes, "reference types")
      .addFeature(FeatureSet::Multivalue, "multivalue functions")
      .addFeature(FeatureSet::GC, "garbage collection")
      .addFeature(FeatureSet::Memory64, "memory64")
      .addFeature(FeatureSet::GCNNLocals, "GC non-null locals")
      .addFeature(FeatureSet::RelaxedSIMD, "relaxed SIMD")
      .addFeature(FeatureSet::ExtendedConst, "extended const expressions")
      .addFeature(FeatureSet::Strings, "strings")
      .addFeature(FeatureSet::MultiMemories, "multi-memories")
      .add("--enable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --enable-typed-function-references is deprecated\n";
           })
      .add("--disable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --disable-typed-function-references is deprecated\n";
           })
      .add("--no-validation",
           "-n",
           "Disables validation, assumes inputs are correct",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string& argument) {
             passOptions.validate = false;
           })
      .add("--pass-arg",
           "-pa",
           "An argument passed along to optimization passes being run. Must be "
           "in the form KEY@VALUE",
           ToolOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& argument) {
             std::string key, value;
             auto colon = argument.find('@');
             if (colon == std::string::npos) {
               key = argument;
               value = "1";
             } else {
               key = argument.substr(0, colon);
               value = argument.substr(colon + 1);
             }
             passOptions.arguments[key] = value;
           })
      .add("--nominal",
           "",
           "Force all GC type definitions to be parsed as nominal.",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             setTypeSystem(TypeSystem::Nominal);
           })
      .add("--hybrid",
           "",
           "Force all GC type definitions to be parsed using the isorecursive "
           "hybrid type system.",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             setTypeSystem(TypeSystem::Isorecursive);
           })
      .add(
        "--closed-world",
        "-cw",
        "Assume code outside of the module does not inspect or interact with "
        "GC and function references, even if they are passed out. The outside "
        "may hold on to them and pass them back in, but not inspect their "
        "contents or call them.",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.closedWorld = true;
        });
  }